

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iota_generator.cpp
# Opt level: O0

void __thiscall IotaGenerator_InitialValue_Test::TestBody(IotaGenerator_InitialValue_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  unsigned_long local_80;
  value_type local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  iota_generator g2;
  Message local_50 [3];
  unsigned_long local_38;
  value_type local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  iota_generator g1;
  IotaGenerator_InitialValue_Test *this_local;
  
  iota_generator::iota_generator((iota_generator *)&gtest_ar.message_,0);
  local_30 = iota_generator::operator*((iota_generator *)&gtest_ar.message_);
  local_38 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_28,"*g1","0UL",&local_30,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&g2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker_poker/test_iota_generator.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&g2,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&g2);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  iota_generator::iota_generator((iota_generator *)&gtest_ar_1.message_,3);
  local_78 = iota_generator::operator*((iota_generator *)&gtest_ar_1.message_);
  local_80 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_70,"*g2","3UL",&local_78,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker_poker/test_iota_generator.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST (IotaGenerator, InitialValue) {
    iota_generator g1;
    EXPECT_EQ (*g1, 0UL);

    iota_generator g2 (3);
    EXPECT_EQ (*g2, 3UL);
}